

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<ProKey,_QSet<ProKey>_>_>::freeData
          (Span<QHashPrivate::Node<ProKey,_QSet<ProKey>_>_> *this)

{
  Entry *pEVar1;
  Entry *pEVar2;
  int *piVar3;
  ulong uVar4;
  long lVar5;
  
  if (this->entries != (Entry *)0x0) {
    lVar5 = 0;
    do {
      uVar4 = (ulong)this->offsets[lVar5];
      if (uVar4 != 0xff) {
        pEVar2 = this->entries;
        pEVar1 = pEVar2 + uVar4;
        QHash<ProKey,_QHashDummyValue>::~QHash
                  ((QHash<ProKey,_QHashDummyValue> *)((pEVar1->storage).data + 0x30));
        piVar3 = *(int **)(pEVar1->storage).data;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            QArrayData::deallocate(*(QArrayData **)pEVar2[uVar4].storage.data,2,0x10);
          }
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x80);
    if (this->entries != (Entry *)0x0) {
      operator_delete__(this->entries);
    }
    this->entries = (Entry *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }